

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O3

int equal_wildcard(uchar *pattern,size_t pattern_len,uchar *subject,size_t subject_len,uint flags)

{
  int iVar1;
  int iVar2;
  long lVar3;
  byte *a;
  uchar *puVar4;
  byte *pbVar5;
  byte bVar6;
  size_t sVar7;
  size_t sVar8;
  bool bVar9;
  
  if (subject_len < 2) {
    if (pattern_len == 0) goto LAB_00492ea4;
  }
  else if ((pattern_len == 0) || (*subject == '.')) goto LAB_00492ea4;
  bVar6 = 1;
  pbVar5 = (byte *)0x0;
  iVar2 = 0;
  a = pattern;
  sVar8 = pattern_len;
  do {
    if (*a == 0x2a) {
      bVar9 = true;
      if (sVar8 != 1) {
        bVar9 = a[1] == 0x2e;
      }
      if ((pbVar5 != (byte *)0x0) || ((bVar9 & bVar6 & ((bVar6 & 8) == 0 && iVar2 == 0)) != 1))
      goto LAB_00492ea4;
      bVar6 = bVar6 & 0xf6;
      iVar2 = 0;
      pbVar5 = a;
    }
    else {
      iVar1 = OPENSSL_isalnum((uint)*a);
      if (iVar1 == 0) {
        if (*a == 0x2d) {
          if ((bVar6 & 1) != 0) goto LAB_00492ea4;
          bVar6 = bVar6 | 4;
        }
        else {
          if ((*a != 0x2e) || ((bVar6 & 5) != 0)) goto LAB_00492ea4;
          iVar2 = iVar2 + 1;
          bVar6 = 1;
        }
      }
      else {
        if ((3 < sVar8 && (bVar6 & 1) != 0) &&
           (iVar1 = OPENSSL_strncasecmp((char *)a,"xn--",4), iVar1 == 0)) {
          bVar6 = 8;
        }
        bVar6 = bVar6 & 0xfa;
      }
    }
    a = a + 1;
    sVar8 = sVar8 - 1;
  } while (sVar8 != 0);
  if ((pbVar5 != (byte *)0x0 && 1 < iVar2) && (bVar6 & 5) == 0) {
    sVar8 = (long)pbVar5 - (long)pattern;
    puVar4 = pattern + pattern_len + ~(ulong)pbVar5;
    if (subject_len < puVar4 + sVar8) {
      return 0;
    }
    iVar2 = equal_nocase(pattern,sVar8,subject,sVar8,flags);
    if (iVar2 != 0) {
      sVar7 = subject_len - (long)puVar4;
      iVar2 = equal_nocase(subject + sVar7,(size_t)puVar4,pbVar5 + 1,(size_t)puVar4,flags);
      if (iVar2 != 0) {
        if ((pbVar5 == pattern) && (pbVar5[1] == 0x2e)) {
          if ((uchar *)subject_len == puVar4) {
            return 0;
          }
        }
        else if ((3 < subject_len) &&
                (iVar2 = OPENSSL_strncasecmp((char *)subject,"xn--",4), iVar2 == 0)) {
          return 0;
        }
        puVar4 = subject + sVar8;
        if (subject + sVar7 == puVar4 + 1) {
          if (sVar7 == sVar8) {
            return 1;
          }
          if (*puVar4 == '*') {
            return 1;
          }
        }
        else if (sVar7 == sVar8) {
          return 1;
        }
        lVar3 = 0;
        while ((iVar2 = OPENSSL_isalnum((uint)puVar4[lVar3]), iVar2 != 0 || (puVar4[lVar3] == '-')))
        {
          lVar3 = lVar3 + 1;
          if ((subject_len - pattern_len) + 1 == lVar3) {
            return 1;
          }
        }
      }
    }
    return 0;
  }
LAB_00492ea4:
  iVar2 = equal_nocase(pattern,pattern_len,subject,subject_len,flags);
  return iVar2;
}

Assistant:

static int equal_wildcard(const unsigned char *pattern, size_t pattern_len,
                          const unsigned char *subject, size_t subject_len,
                          unsigned int flags) {
  const unsigned char *star = NULL;

  // Subject names starting with '.' can only match a wildcard pattern
  // via a subject sub-domain pattern suffix match.
  if (!(subject_len > 1 && subject[0] == '.')) {
    star = valid_star(pattern, pattern_len, flags);
  }
  if (star == NULL) {
    return equal_nocase(pattern, pattern_len, subject, subject_len, flags);
  }
  return wildcard_match(pattern, star - pattern, star + 1,
                        (pattern + pattern_len) - star - 1, subject,
                        subject_len, flags);
}